

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall
ProString::endsWith<char_const(&)[2],QString&>
          (ProString *this,QStringBuilder<const_char_(&)[2],_QString_&> *str)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<const_char_(&)[2],_QString_&>::convertTo<QString>((QString *)&local_30,str);
  bVar1 = endsWith(this,(QString *)&local_30,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const QStringBuilder<A, B> &str) { return endsWith(QString(str)); }